

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O3

int __thiscall amrex::BndryRegister::init(BndryRegister *this,EVP_PKEY_CTX *ctx)

{
  uint ncomp;
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  EVP_PKEY_CTX *pEVar8;
  BoxArray *pBVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  Array4<double> dfab;
  Array4<const_double> sfab;
  FabSetIter mfi;
  long local_198;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  pEVar8 = ctx + 0x908;
  pBVar9 = &this->grids;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)&pBVar9->m_bat = *(undefined8 *)pEVar8;
    pEVar8 = pEVar8 + 8;
    pBVar9 = (BoxArray *)&(pBVar9->m_bat).m_op.m_bndryReg.m_typ;
  }
  (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(ctx + 0x950);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x958));
  (this->grids).m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)(ctx + 0x960);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x968));
  lVar4 = 0;
  do {
    lVar1 = lVar4 * 0x180;
    ncomp = *(uint *)(ctx + lVar1 + 0xd4);
    FabSet::define(this->bndry + lVar4,(BoxArray *)(ctx + lVar1 + 0x10),
                   (DistributionMapping *)(ctx + 0x78),ncomp);
    MFIter::MFIter(&local_90,(FabArrayBase *)(ctx + lVar1 + 8),'\0');
    while( true ) {
      if (local_90.endIndex <= local_90.currentIndex) break;
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)(ctx + lVar1 + 8),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)(this->bndry + lVar4),&local_90);
      if (0 < (int)ncomp) {
        lVar10 = (long)local_12c.smallend.vect[1];
        local_198 = 0;
        uVar3 = 0;
        do {
          iVar6 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar11 = (long)local_d0.p +
                         local_d0.nstride * local_198 +
                         (lVar10 - local_d0.begin.y) * local_d0.jstride * 8 +
                         ((long)iVar6 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                lVar7 = (long)local_110.p +
                        local_110.nstride * local_198 +
                        (lVar10 - local_110.begin.y) * local_110.jstride * 8 +
                        ((long)iVar6 - (long)local_110.begin.z) * local_110.kstride * 8 +
                        (long)local_110.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                lVar2 = lVar10;
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar5 = 0;
                    do {
                      *(undefined8 *)(lVar7 + lVar5 * 8) = *(undefined8 *)(lVar11 + lVar5 * 8);
                      lVar5 = lVar5 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar5);
                  }
                  lVar2 = lVar2 + 1;
                  lVar11 = lVar11 + local_d0.jstride * 8;
                  lVar7 = lVar7 + local_110.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar2);
              }
              bVar12 = iVar6 != local_12c.bigend.vect[2];
              iVar6 = iVar6 + 1;
            } while (bVar12);
          }
          uVar3 = uVar3 + 1;
          local_198 = local_198 + 8;
        } while (uVar3 != ncomp);
      }
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return 6;
}

Assistant:

void
BndryRegister::init (const BndryRegister& src)
{
    grids = src.grids;

    for (int idim = 0; idim < 2*AMREX_SPACEDIM; idim++)
    {
        const int ncomp = src.bndry[idim].nComp();
        bndry[idim].define(src.bndry[idim].boxArray(), src.DistributionMap(), ncomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter mfi(src.bndry[idim]); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            auto const sfab = src.bndry[idim].array(mfi);
            auto       dfab =     bndry[idim].array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n);
            });
        }
    }
}